

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void emit_scalar_assign(c2m_ctx_t c2m_ctx,op_t var,op_t *val,MIR_type_t t,int ignore_others_p)

{
  uint uVar1;
  MIR_context_t ctx;
  sbyte sVar2;
  undefined8 uVar3;
  void *pvVar4;
  undefined8 uVar5;
  int64_t iVar6;
  char *pcVar7;
  undefined8 uVar8;
  MIR_disp_t MVar9;
  int iVar10;
  ulong u;
  MIR_insn_t_conflict pMVar11;
  MIR_insn_code_t code;
  byte bVar12;
  long i;
  op_t *__return_storage_ptr__;
  undefined1 local_238 [32];
  anon_union_32_12_57d33f68_for_u aStack_218;
  long local_1f0;
  undefined1 local_1e8 [32];
  anon_union_32_12_57d33f68_for_u aStack_1c8;
  op_t local_1a8;
  undefined1 local_168 [32];
  anon_union_32_12_57d33f68_for_u aaStack_148 [8];
  
  if ((var.decl == (decl_t)0x0) || ((var.decl)->bit_offset < 0)) {
    if (t == MIR_T_F) {
      code = MIR_FMOV;
    }
    else if (t == MIR_T_D) {
      code = MIR_DMOV;
    }
    else {
      code = (uint)(t == MIR_T_LD) * 3;
    }
    local_1e8._0_8_ = (val->mir_op).data;
    local_1e8._8_8_ = *(undefined8 *)&(val->mir_op).field_0x8;
    local_1e8._16_8_ = (val->mir_op).u.i;
    local_1e8._24_8_ = (val->mir_op).u.str.s;
    aStack_1c8.i = *(int64_t *)((long)&(val->mir_op).u + 0x10);
    aStack_1c8.str.s = (char *)(val->mir_op).u.mem.disp;
    pMVar11 = MIR_new_insn(c2m_ctx->ctx,code);
    MIR_append_insn(c2m_ctx->ctx,c2m_ctx->gen_ctx->curr_func,pMVar11);
  }
  else {
    ctx = c2m_ctx->ctx;
    iVar10 = (var.decl)->width;
    raw_type_size(c2m_ctx,((var.decl)->decl_spec).type);
    if (var.mir_op._8_1_ != '\n') {
      __assert_fail("var.mir_op.mode == MIR_OP_MEM",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2dce,"void emit_scalar_assign(c2m_ctx_t, op_t, op_t *, MIR_type_t, int)");
    }
    bVar12 = (byte)iVar10;
    sVar2 = (bVar12 < 0x41) * ('@' - bVar12);
    u = (ulong)(-1L << sVar2) >> sVar2;
    uVar1 = (var.decl)->bit_offset;
    local_1f0 = (long)iVar10;
    get_new_temp((op_t *)local_1e8,c2m_ctx,MIR_T_I64);
    get_new_temp(&local_1a8,c2m_ctx,MIR_T_I64);
    __return_storage_ptr__ = (op_t *)local_168;
    get_new_temp(__return_storage_ptr__,c2m_ctx,MIR_T_I64);
    if (ignore_others_p == 0) {
      pMVar11 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
      MIR_append_insn(c2m_ctx->ctx,c2m_ctx->gen_ctx->curr_func,pMVar11);
      MIR_new_uint_op(ctx,~(u << ((ulong)uVar1 & 0x3f)));
      pMVar11 = MIR_new_insn(c2m_ctx->ctx,MIR_AND);
      emit_insn_opt(c2m_ctx,pMVar11);
    }
    iVar10 = signed_integer_type_p(((var.decl)->decl_spec).type);
    if (iVar10 == 0) {
      local_238._0_8_ = (val->mir_op).data;
      local_238._8_8_ = *(undefined8 *)&(val->mir_op).field_0x8;
      local_238._16_8_ = (val->mir_op).u.i;
      local_238._24_8_ = (val->mir_op).u.str.s;
      aStack_218.i = *(int64_t *)((long)&(val->mir_op).u + 0x10);
      aStack_218.str.s = (char *)(val->mir_op).u.mem.disp;
      pMVar11 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
      emit_insn_opt(c2m_ctx,pMVar11);
    }
    else {
      i = 0x40 - local_1f0;
      MIR_new_int_op(ctx,i);
      local_238._0_8_ = (val->mir_op).data;
      local_238._8_8_ = *(undefined8 *)&(val->mir_op).field_0x8;
      local_238._16_8_ = (val->mir_op).u.i;
      local_238._24_8_ = (val->mir_op).u.str.s;
      aStack_218.i = *(int64_t *)((long)&(val->mir_op).u + 0x10);
      aStack_218.str.s = (char *)(val->mir_op).u.mem.disp;
      pMVar11 = MIR_new_insn(c2m_ctx->ctx,MIR_LSH);
      emit_insn_opt(c2m_ctx,pMVar11);
      MIR_new_int_op(ctx,i);
      pMVar11 = MIR_new_insn(c2m_ctx->ctx,MIR_RSH);
      emit_insn_opt(c2m_ctx,pMVar11);
      __return_storage_ptr__ = (op_t *)local_1e8;
    }
    uVar3 = *(undefined8 *)&__return_storage_ptr__->field_0x8;
    pvVar4 = (__return_storage_ptr__->mir_op).data;
    uVar5 = *(undefined8 *)&(__return_storage_ptr__->mir_op).field_0x8;
    iVar6 = (__return_storage_ptr__->mir_op).u.i;
    pcVar7 = (__return_storage_ptr__->mir_op).u.str.s;
    uVar8 = *(undefined8 *)((long)&(__return_storage_ptr__->mir_op).u + 0x10);
    MVar9 = (__return_storage_ptr__->mir_op).u.mem.disp;
    val->decl = __return_storage_ptr__->decl;
    *(undefined8 *)&val->field_0x8 = uVar3;
    (val->mir_op).data = pvVar4;
    *(undefined8 *)&(val->mir_op).field_0x8 = uVar5;
    (val->mir_op).u.i = iVar6;
    (val->mir_op).u.str.s = pcVar7;
    *(undefined8 *)((long)&(val->mir_op).u + 0x10) = uVar8;
    (val->mir_op).u.mem.disp = MVar9;
    MIR_new_uint_op(ctx,u);
    pMVar11 = MIR_new_insn(c2m_ctx->ctx,MIR_AND);
    emit_insn_opt(c2m_ctx,pMVar11);
    get_new_temp((op_t *)local_238,c2m_ctx,MIR_T_I64);
    if ((long)(var.decl)->bit_offset == 0) {
      local_238._0_8_ = local_168._0_8_;
      local_238._8_8_ = local_168._8_8_;
      local_238._16_8_ = local_168._16_8_;
      local_238._24_8_ = local_168._24_8_;
      aStack_218.i = aaStack_148[0].i;
      aStack_218.str.s = (char *)aaStack_148[0]._8_8_;
      aStack_218._16_8_ = aaStack_148[0]._16_8_;
      aStack_218.mem.disp = aaStack_148[0].mem.disp;
    }
    else {
      MIR_new_int_op(ctx,(long)(var.decl)->bit_offset);
      pMVar11 = MIR_new_insn(c2m_ctx->ctx,MIR_LSH);
      emit_insn_opt(c2m_ctx,pMVar11);
    }
    if (ignore_others_p == 0) {
      pMVar11 = MIR_new_insn(c2m_ctx->ctx,MIR_OR);
      emit_insn_opt(c2m_ctx,pMVar11);
    }
    pMVar11 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
    emit_insn_opt(c2m_ctx,pMVar11);
  }
  return;
}

Assistant:

static void emit_scalar_assign (c2m_ctx_t c2m_ctx, op_t var, op_t *val, MIR_type_t t,
                                int ignore_others_p) {
  if (var.decl == NULL || var.decl->bit_offset < 0) {
    emit2_noopt (c2m_ctx, tp_mov (t), var.mir_op, val->mir_op);
  } else {
    MIR_context_t ctx = c2m_ctx->ctx;
    int width = var.decl->width;
    uint64_t mask, mask2;
    op_t temp_op1, temp_op2, temp_op3, temp_op4;
    size_t MIR_UNUSED size = type_size (c2m_ctx, var.decl->decl_spec.type) * MIR_CHAR_BIT;

    assert (var.mir_op.mode == MIR_OP_MEM); /*???*/
    mask = 0xffffffffffffffff >> (64 - width);
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
    mask2 = ~(mask << var.decl->bit_offset);
#else
    mask2 = ~(mask << (size - var.decl->bit_offset - width));
#endif
    temp_op1 = get_new_temp (c2m_ctx, MIR_T_I64);
    temp_op2 = get_new_temp (c2m_ctx, MIR_T_I64);
    temp_op3 = get_new_temp (c2m_ctx, MIR_T_I64);
    if (!ignore_others_p) {
      emit2_noopt (c2m_ctx, MIR_MOV, temp_op2.mir_op, var.mir_op);
      emit3 (c2m_ctx, MIR_AND, temp_op2.mir_op, temp_op2.mir_op, MIR_new_uint_op (ctx, mask2));
    }
    if (!signed_integer_type_p (var.decl->decl_spec.type)) {
      emit2 (c2m_ctx, MIR_MOV, temp_op1.mir_op, val->mir_op);
      *val = temp_op3;
    } else {
      emit3 (c2m_ctx, MIR_LSH, temp_op1.mir_op, val->mir_op, MIR_new_int_op (ctx, 64 - width));
      emit3 (c2m_ctx, MIR_RSH, temp_op1.mir_op, temp_op1.mir_op, MIR_new_int_op (ctx, 64 - width));
      *val = temp_op1;
    }
    emit3 (c2m_ctx, MIR_AND, temp_op3.mir_op, temp_op1.mir_op, MIR_new_uint_op (ctx, mask));
    temp_op4 = get_new_temp (c2m_ctx, MIR_T_I64);
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
    if (var.decl->bit_offset == 0) {
      temp_op4 = temp_op3;
    } else {
      emit3 (c2m_ctx, MIR_LSH, temp_op4.mir_op, temp_op3.mir_op,
             MIR_new_int_op (ctx, var.decl->bit_offset));
    }
#else
    if (size - var.decl->bit_offset - width == 0) {
      temp_op4 = temp_op3;
    } else {
      emit3 (c2m_ctx, MIR_LSH, temp_op4.mir_op, temp_op3.mir_op,
             MIR_new_int_op (ctx, size - var.decl->bit_offset - width));
    }
#endif
    if (!ignore_others_p) {
      emit3 (c2m_ctx, MIR_OR, temp_op4.mir_op, temp_op4.mir_op, temp_op2.mir_op);
    }
    emit2 (c2m_ctx, MIR_MOV, var.mir_op, temp_op4.mir_op);
  }
}